

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stub.c
# Opt level: O3

Solver * stub_solver_create(Solver *__return_storage_ptr__,Instance *instance,
                           SolverTypedParams *tparams,double timelimit,int32_t randomseed)

{
  __return_storage_ptr__->data = (SolverData *)0x0;
  __return_storage_ptr__->sigterm_occured = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x9 = 0;
  __return_storage_ptr__->sigterm_occured_int = 0;
  __return_storage_ptr__->set_params = (_func__Bool_Solver_ptr_SolverParams_ptr *)0x0;
  __return_storage_ptr__->solve = solve;
  __return_storage_ptr__->destroy = destroy;
  return __return_storage_ptr__;
}

Assistant:

Solver stub_solver_create(const Instance *instance, SolverTypedParams *tparams,
                          double timelimit, int32_t randomseed) {
    UNUSED_PARAM(instance);
    UNUSED_PARAM(tparams);
    UNUSED_PARAM(timelimit);
    UNUSED_PARAM(randomseed);
    Solver solver = {0};
    solver.solve = solve;
    solver.destroy = destroy;
    return solver;
}